

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O2

Stream * rw::d3d9::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint *puVar5;
  uint *puVar6;
  void *pvVar7;
  uint16 *puVar8;
  uint8 *puVar9;
  char *pcVar10;
  int *piVar11;
  uint uVar12;
  uint *puVar13;
  long lVar14;
  FILE *__stream;
  VertexElement elements [12];
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    uVar2 = Stream::readU32(stream);
    if (uVar2 == 9) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 164"
      ;
      puVar4 = (undefined4 *)(*DAT_00145dd8)(0x70,0x3000f);
      *(undefined4 **)((long)object + 0x98) = puVar4;
      *puVar4 = 9;
      uVar3 = Stream::readI32(stream);
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 169"
      ;
      puVar5 = (uint *)(*DAT_00145dd8)((long)(int)uVar3,0x1000f);
      (*stream->_vptr_Stream[4])(stream,puVar5,(ulong)uVar3);
      puVar4[1] = *puVar5;
      uVar3 = puVar5[1];
      puVar4[2] = uVar3;
      *(undefined8 *)(puVar4 + 4) = 0;
      puVar4[6] = puVar5[3];
      puVar4[0x14] = puVar5[0xc];
      *(undefined8 *)(puVar4 + 0x16) = 0;
      puVar4[0x18] = puVar5[0xe];
      puVar4[0x19] = puVar5[0xf];
      puVar13 = puVar5 + 0x10;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 181"
      ;
      puVar6 = (uint *)(*DAT_00145dd8)((ulong)uVar3 * 0x30,0x3000f);
      *(uint **)(puVar4 + 0x1a) = puVar6;
      uVar3 = puVar4[2];
      for (uVar12 = 0; uVar12 < uVar3; uVar12 = uVar12 + 1) {
        *puVar6 = *puVar13;
        puVar6[1] = puVar13[1];
        *(undefined8 *)(puVar6 + 2) =
             *(undefined8 *)(*(long *)((long)object + 0x80) + (ulong)puVar13[2] * 8);
        puVar6[4] = puVar13[3];
        puVar6[6] = 0;
        puVar6[7] = 0;
        puVar6[8] = 0;
        puVar6[9] = puVar13[6];
        puVar6[10] = puVar13[7];
        puVar6[0xb] = puVar13[8];
        puVar13 = puVar13 + 9;
        puVar6 = puVar6 + 0xc;
      }
      uVar2 = Stream::readU32(stream);
      (*stream->_vptr_Stream[4])(stream,elements,(ulong)(uVar2 * 8));
      pvVar7 = createVertexDeclaration(elements);
      *(void **)(puVar4 + 0x16) = pvVar7;
      pvVar7 = d3d::createIndexBuffer(puVar4[0x18] * 2,false);
      *(void **)(puVar4 + 4) = pvVar7;
      puVar8 = d3d::lockIndices(pvVar7,0,0,0);
      (*stream->_vptr_Stream[4])(stream,puVar8,(ulong)(uint)(puVar4[0x18] * 2));
      d3d::unlockIndices(*(void **)(puVar4 + 4));
      puVar6 = puVar5;
      for (lVar14 = 0; lVar14 != 0x30; lVar14 = lVar14 + 0x18) {
        (*stream->_vptr_Stream[4])(stream,puVar6,0x10);
        uVar3 = *puVar6;
        *(undefined4 *)((long)puVar4 + lVar14 + 0x28) = 0;
        *(ulong *)((long)puVar4 + lVar14 + 0x20) = (ulong)uVar3;
        uVar12 = puVar6[2];
        *(uint *)((long)puVar4 + lVar14 + 0x2c) = uVar12;
        *(short *)((long)puVar4 + lVar14 + 0x30) = (short)puVar6[3];
        *(undefined1 *)((long)puVar4 + lVar14 + 0x32) = *(undefined1 *)((long)puVar6 + 0xe);
        *(undefined1 *)((long)puVar4 + lVar14 + 0x33) = *(undefined1 *)((long)puVar6 + 0xf);
        if ((ulong)uVar3 != 0) {
          pvVar7 = d3d::createVertexBuffer(uVar12 * puVar4[0x19],0,false);
          *(void **)((long)puVar4 + lVar14 + 0x20) = pvVar7;
          puVar9 = d3d::lockVertices(pvVar7,0,0,0);
          (*stream->_vptr_Stream[4])
                    (stream,puVar9,
                     (ulong)(uint)(puVar4[0x19] * *(int *)((long)puVar4 + lVar14 + 0x2c)));
          d3d::unlockVertices(*(void **)((long)puVar4 + lVar14 + 0x20));
        }
        puVar6 = puVar6 + 4;
      }
      uVar3 = puVar4[2];
      piVar11 = (int *)(*(long *)(puVar4 + 0x1a) + 0x20);
      for (uVar12 = 0; uVar12 < uVar3; uVar12 = uVar12 + 1) {
        *piVar11 = (uint)puVar4[10] / (uint)puVar4[0xb] + piVar11[-7];
        piVar11 = piVar11 + 0xc;
      }
      (*DAT_00145dd0)(puVar5);
      return stream;
    }
    elements[0].stream = 2;
    elements[0].offset = 0;
    elements[0].type = '\x06';
    elements[0].method = '\0';
    elements[0].usage = '\0';
    elements[0].usageIndex = 0x80;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp"
            ,0xa1);
    __stream = _stderr;
    pcVar10 = dbgsprint(0x80000006,(ulong)uVar2);
  }
  else {
    elements[0].stream = 2;
    elements[0].offset = 0;
    elements[0].type = '\x04';
    elements[0].method = '\0';
    elements[0].usage = '\0';
    elements[0].usageIndex = 0x80;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp"
            ,0x9c);
    __stream = _stderr;
    pcVar10 = dbgsprint(0x80000004,"STRUCT");
  }
  fprintf(__stream,"%s\n",pcVar10);
  setError((Error *)elements);
  return (Stream *)0x0;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_D3D9){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_D3D9;

	int32 size = stream->readI32();
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->read8(data, size);
	uint8 *p = data;
	header->serialNumber = *(uint32*)p; p += 4;
	header->numMeshes = *(uint32*)p; p += 4;
	header->indexBuffer = nil; p += 4;
	header->primType = *(uint32*)p; p += 4;
	p += 16*2;	// skip vertex streams, they're repeated with the vertex buffers
	header->useOffsets = *(bool32*)p; p += 4;
	header->vertexDeclaration = nil; p += 4;
	header->totalNumIndex = *(uint32*)p; p += 4;
	header->totalNumVertex = *(uint32*)p; p += 4;
	header->inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		inst->numIndex = *(uint32*)p; p += 4;
		inst->minVert = *(uint32*)p; p += 4;
		uint32 matid = *(uint32*)p; p += 4;
		inst->material = geometry->matList.materials[matid];
		inst->vertexAlpha = *(bool32*)p; p += 4;
		inst->vertexShader = nil; p += 4;
		inst->baseIndex = 0; p += 4;
		inst->numVertices = *(uint32*)p; p += 4;
		inst->startIndex = *(uint32*)p; p += 4;
		inst->numPrimitives = *(uint32*)p; p += 4;
		inst++;
	}

	VertexElement elements[NUMDECLELT];
	uint32 numDeclarations = stream->readU32();
	stream->read8(elements, numDeclarations*8);
	header->vertexDeclaration = createVertexDeclaration(elements);

	assert(header->indexBuffer == nil);
	header->indexBuffer = createIndexBuffer(header->totalNumIndex*2, false);
	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	stream->read8(indices, 2*header->totalNumIndex);
	unlockIndices(header->indexBuffer);

	VertexStream *s;
	p = data;
	for(int i = 0; i < 2; i++){
		stream->read8(p, 16);
		s = &header->vertexStream[i];
		s->vertexBuffer = (void*)(uintptr)*(uint32*)p; p += 4;
		s->offset = 0; p += 4;
		s->stride = *(uint32*)p; p += 4;
		s->geometryFlags = *(uint16*)p; p += 2;
		s->managed = *p++;
		s->dynamicLock = *p++;

		if(s->vertexBuffer == nil)
			continue;
		// TODO: use dynamic VB when doing morphing
		assert(s->vertexBuffer == nil);
		s->vertexBuffer = createVertexBuffer(s->stride*header->totalNumVertex, 0, false);
		uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->read8(verts, s->stride*header->totalNumVertex);
		unlockVertices(s->vertexBuffer);
	}

	// TODO: somehow depends on number of streams used (baseIndex = minVert when more than one)
	inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		inst->baseIndex = inst->minVert + header->vertexStream[0].offset / header->vertexStream[0].stride;
		inst++;
	}

	rwFree(data);
	return stream;
}